

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O3

bool xercesc_4_0::XMLChar1_1::isValidName(XMLCh *toCheck)

{
  XMLCh XVar1;
  bool bVar2;
  bool bVar3;
  XMLCh *pXVar4;
  
  if ((ushort)(*toCheck + L'⠀') < 0x380) {
    if (0xfbff < (ushort)(toCheck[1] + L'\x2000')) {
      pXVar4 = toCheck + 2;
LAB_0024aacf:
      XVar1 = *pXVar4;
      if (XVar1 != L'\0') {
        bVar2 = false;
        do {
          pXVar4 = pXVar4 + 1;
          if ((XVar1 & 0xfc00U) == 0xdc00) {
            bVar3 = false;
            if (!bVar2) {
              return false;
            }
          }
          else if ((XVar1 & 0xfc00U) == 0xd800) {
            if (0xdb7f < (ushort)XVar1) {
              return false;
            }
            bVar3 = true;
            if (bVar2) {
              return false;
            }
          }
          else {
            if (bVar2) {
              return false;
            }
            bVar3 = false;
            if (((&fgCharCharsTable1_1)[(ushort)XVar1] & 4) == 0) {
              return false;
            }
          }
          bVar2 = bVar3;
          XVar1 = *pXVar4;
        } while (XVar1 != L'\0');
      }
      return true;
    }
  }
  else if (((&fgCharCharsTable1_1)[(ushort)*toCheck] & 2) != 0) {
    pXVar4 = toCheck + 1;
    goto LAB_0024aacf;
  }
  return false;
}

Assistant:

bool XMLChar1_1::isValidName(const   XMLCh* const    toCheck)
{
    const XMLCh* curCh = toCheck;

    XMLCh nextCh = *curCh++;
    if ((nextCh >= 0xD800) && (nextCh <= 0xDB7F))
	{
        nextCh = *curCh++;
        if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
		{
            return false;
		}
    }
    else if (!(fgCharCharsTable1_1[nextCh] & gFirstNameCharMask))
	{
            return false;
	}

    bool    gotLeadingSurrogate = false;

    while (*curCh != 0)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
			{
                gotLeadingSurrogate = true;
			}
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
           if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
           {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate)
				{
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNameCharMask))
                {
                    return false;
                }
            }
           gotLeadingSurrogate = false;
        }
    }
    return true;
}